

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS ref_import_msh(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_DBL *pRVar1;
  REF_CELL ref_cell;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  FILE *__stream;
  REF_CELL *ppRVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  REF_GRID pRVar12;
  REF_NODE ref_node;
  int *piVar13;
  bool bVar14;
  REF_INT n1;
  REF_INT n0;
  int n;
  REF_INT n2;
  REF_INT nnode;
  int datasize;
  int filetype;
  REF_INT ntri;
  REF_INT id;
  double version;
  int parameric;
  REF_INT new_cell;
  REF_INT n3;
  REF_INT new_node;
  REF_INT type;
  REF_INT nedge;
  REF_DBL y;
  REF_DBL x;
  int entity_tag;
  int entity_dim;
  REF_INT nelem;
  REF_INT dim;
  REF_DBL z;
  int node_tag;
  REF_INT dummy;
  char line [1024];
  int local_5b0;
  int local_5ac;
  FILE *local_5a8;
  int local_59c;
  int local_598;
  uint local_594;
  uint local_590;
  uint local_58c;
  int local_588;
  int local_584;
  long local_580;
  uint local_578;
  undefined4 uStack_574;
  uint local_56c;
  REF_NODE local_568;
  REF_INT local_55c;
  int local_558;
  int local_554;
  uint local_550;
  int local_54c;
  REF_DBL local_548;
  REF_DBL local_540;
  undefined1 local_538 [4];
  undefined1 local_534 [4];
  uint local_530;
  int local_52c;
  int local_528 [4];
  int local_518;
  ulong local_508;
  REF_GRID local_4b0;
  REF_CELL *local_4a8;
  REF_CELL *local_4a0;
  REF_CELL *local_498;
  REF_CELL *local_490;
  REF_CELL *local_488;
  REF_CELL *local_480;
  REF_CELL *local_478;
  REF_CELL *local_470;
  REF_CELL *local_468;
  REF_CELL *local_460;
  REF_CELL *local_458;
  REF_CELL *local_450;
  REF_DBL local_448;
  undefined1 local_440 [4];
  undefined1 local_43c [4];
  undefined4 local_438;
  short sStack_434;
  undefined1 uStack_432;
  undefined1 uStack_431;
  char local_430;
  undefined1 uStack_42f;
  undefined2 uStack_42e;
  undefined3 uStack_42c;
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    pRVar12 = *ref_grid_ptr;
    ref_node = pRVar12->node;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x3e6,"ref_import_msh","unable to open file");
      uVar3 = 2;
    }
    else {
      iVar4 = feof(__stream);
      if (iVar4 == 0) {
        local_458 = pRVar12->cell + 2;
        local_460 = pRVar12->cell + 5;
        local_468 = pRVar12->cell + 0xc;
        local_470 = pRVar12->cell + 4;
        local_478 = pRVar12->cell + 1;
        local_480 = pRVar12->cell + 9;
        local_488 = pRVar12->cell + 10;
        local_490 = pRVar12->cell + 0xb;
        local_498 = pRVar12->cell + 8;
        local_4a0 = pRVar12->cell + 6;
        local_4a8 = pRVar12->cell + 3;
        local_450 = pRVar12->cell;
        uVar3 = 0;
        local_5a8 = __stream;
        local_568 = ref_node;
        do {
          iVar4 = __isoc99_fscanf(__stream,"%s",&local_438);
          if (iVar4 == -1) {
            return 0;
          }
          if (iVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x3eb,"ref_import_msh","line read failed",1,(long)iVar4);
            return 1;
          }
          if (CONCAT11(uStack_42f,local_430) == 0x6e &&
              CONCAT17(uStack_431,CONCAT16(uStack_432,CONCAT24(sStack_434,local_438))) ==
              0x6f69736e656d6944) {
            iVar4 = __isoc99_fscanf(__stream,"%d",&local_52c);
            if (iVar4 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x3f0,"ref_import_msh","read dim",1,(long)iVar4);
              return 1;
            }
            if (local_52c == 2) {
              pRVar12->twod = 1;
            }
          }
          if (local_430 == '\0' &&
              CONCAT17(uStack_431,CONCAT16(uStack_432,CONCAT24(sStack_434,local_438))) ==
              0x7365636974726556) {
            iVar4 = __isoc99_fscanf(__stream,"%d",&local_594);
            if (iVar4 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x3f5,"ref_import_msh","read nnode",1,(long)iVar4);
              return 1;
            }
            if (0 < (int)local_594) {
              lVar11 = 0;
              do {
                iVar4 = __isoc99_fscanf(__stream,"%lf %lf %d",&local_540,&local_548,local_43c);
                if (iVar4 != 3) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x3f7,"ref_import_msh","read xy",3,(long)iVar4);
                  return 1;
                }
                uVar5 = ref_node_add(ref_node,lVar11,&local_554);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x3f8,"ref_import_msh",(ulong)uVar5,"add node");
                  return uVar5;
                }
                pRVar1 = ref_node->real;
                lVar9 = (long)local_554;
                pRVar1[lVar9 * 0xf] = local_540;
                pRVar1[lVar9 * 0xf + 1] = local_548;
                pRVar1[lVar9 * 0xf + 2] = 0.0;
                lVar11 = lVar11 + 1;
              } while (lVar11 < (int)local_594);
            }
            uVar5 = ref_node_initialize_n_global(ref_node,(long)(int)local_594);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x3fd,"ref_import_msh",(ulong)uVar5,"init glob");
              return uVar5;
            }
          }
          if (sStack_434 == 0x73 && local_438 == 0x65676445) {
            iVar4 = __isoc99_fscanf(__stream,"%d",&local_54c);
            if (iVar4 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x401,"ref_import_msh","read nedge",1,(long)iVar4);
              return 1;
            }
            if (0 < local_54c) {
              iVar4 = 0;
              do {
                iVar6 = __isoc99_fscanf(__stream,"%d %d %d",&local_5ac,&local_5b0,&local_584);
                if (iVar6 != 3) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x403,"ref_import_msh","read edge",3,(long)iVar6);
                  return 1;
                }
                local_5ac = local_5ac + -1;
                local_5b0 = local_5b0 + -1;
                local_528[2] = local_584;
                local_528[0] = local_5ac;
                local_528[1] = local_5b0;
                uVar5 = ref_cell_add(pRVar12->cell[0],local_528,&local_55c);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x40a,"ref_import_msh",(ulong)uVar5,"quad face for an edge");
                  return uVar5;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_54c);
            }
          }
          if (CONCAT11(uStack_42f,local_430) == 0x73 &&
              CONCAT17(uStack_431,CONCAT16(uStack_432,CONCAT24(sStack_434,local_438))) ==
              0x656c676e61697254) {
            iVar4 = __isoc99_fscanf(__stream,"%d",&local_588);
            if (iVar4 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x40f,"ref_import_msh","read ntri",1,(long)iVar4);
              return 1;
            }
            if (0 < local_588) {
              iVar4 = 0;
              do {
                iVar6 = __isoc99_fscanf(__stream,"%d %d %d %d",&local_5ac,&local_5b0,&local_598,
                                        &local_584);
                if (iVar6 != 4) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x411,"ref_import_msh","read tri",4,(long)iVar6);
                  return 1;
                }
                local_5ac = local_5ac + -1;
                local_5b0 = local_5b0 + -1;
                local_598 = local_598 + -1;
                local_528[3] = local_584;
                local_528[0] = local_5ac;
                local_528[1] = local_5b0;
                local_528[2] = local_598;
                uVar5 = ref_cell_add(pRVar12->cell[3],local_528,&local_55c);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x41a,"ref_import_msh",(ulong)uVar5,"tri face for tri");
                  return uVar5;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_588);
            }
          }
          if (CONCAT35(uStack_42c,
                       CONCAT23(uStack_42e,CONCAT12(uStack_42f,CONCAT11(local_430,uStack_431)))) ==
              0x736c6172657461 &&
              CONCAT17(uStack_431,CONCAT16(uStack_432,CONCAT24(sStack_434,local_438))) ==
              0x616c697264617551) {
            iVar4 = __isoc99_fscanf(__stream,"%d",&local_588);
            if (iVar4 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x41f,"ref_import_msh","read ntri",1,(long)iVar4);
              return 1;
            }
            if (0 < local_588) {
              iVar4 = 0;
              do {
                iVar6 = __isoc99_fscanf(__stream,"%d %d %d %d %d",&local_5ac,&local_5b0,&local_598,
                                        &local_558,&local_584);
                if (iVar6 != 5) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x422,"ref_import_msh","read quad",5,(long)iVar6);
                  return 1;
                }
                local_5ac = local_5ac + -1;
                local_5b0 = local_5b0 + -1;
                local_598 = local_598 + -1;
                local_558 = local_558 + -1;
                local_518 = local_584;
                local_528[0] = local_5ac;
                local_528[1] = local_5b0;
                local_528[2] = local_598;
                local_528[3] = local_558;
                uVar5 = ref_cell_add(pRVar12->cell[6],local_528,&local_55c);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x42d,"ref_import_msh",(ulong)uVar5,"qua face for qua");
                  return uVar5;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_588);
            }
          }
          if (CONCAT22(uStack_42e,CONCAT11(uStack_42f,local_430)) == 0x74616d &&
              CONCAT17(uStack_431,CONCAT16(uStack_432,CONCAT24(sStack_434,local_438))) ==
              0x726f466873654d24) {
            iVar4 = __isoc99_fscanf(__stream,"%lf %d %d",&local_578,&local_58c,&local_590);
            uVar5 = local_58c;
            if (iVar4 == 3) {
              if ((long)(int)local_58c != 0) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x436,"ref_import_msh","only ASCII implemented",0,(long)(int)local_58c);
                uVar3 = 1;
              }
              uVar2 = local_590;
              if (uVar5 == 0) {
                if ((long)(int)local_590 != 8) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x437,"ref_import_msh","only doubles implemented",8,(long)(int)local_590);
                  uVar3 = 1;
                }
                if (uVar2 == 8) {
                  bVar14 = true;
                  printf("$MeshFormat %3.1f\n",CONCAT44(uStack_574,local_578));
                  __stream = local_5a8;
                  goto LAB_001a7510;
                }
              }
              bVar14 = false;
              __stream = local_5a8;
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x435,"ref_import_msh","read version file-type data-size",3,(long)iVar4);
              uVar3 = 1;
              bVar14 = false;
            }
LAB_001a7510:
            if (!bVar14) {
              return uVar3;
            }
          }
          if (CONCAT13(uStack_432,CONCAT21(sStack_434,local_438._3_1_)) == 0x736564 &&
              local_438 == 0x646f4e24) {
            iVar4 = __isoc99_fscanf(__stream,"%d %d %d %d",&local_578,&local_594,&local_58c);
            if (iVar4 == 4) {
              printf("$Nodes\n%d %d %d %d\n",(ulong)local_578,(ulong)local_594,(ulong)local_58c,
                     (ulong)local_590);
              if ((int)local_578 < 1) {
                local_580 = 0;
              }
              else {
                iVar4 = 0;
                local_580 = 0;
                do {
                  iVar6 = __isoc99_fscanf(__stream,"%d %d %d %d",local_534,local_538,&local_56c);
                  if (iVar6 == 4) {
                    if (0 < local_59c) {
                      iVar6 = 0;
                      do {
                        iVar7 = __isoc99_fscanf(local_5a8,"%d",local_440);
                        if (iVar7 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x44c,"ref_import_msh","node tag",1,(long)iVar7);
                          uVar3 = 1;
                          bVar14 = false;
                          __stream = local_5a8;
                          goto LAB_001a782a;
                        }
                        iVar6 = iVar6 + 1;
                      } while (iVar6 < local_59c);
                    }
                    bVar14 = true;
                    __stream = local_5a8;
                    if (0 < local_59c) {
                      lVar9 = 0;
                      lVar11 = local_580;
                      do {
                        iVar6 = __isoc99_fscanf(local_5a8,"%lf %lf %lf",&local_540,&local_548,
                                                &local_448);
                        if (iVar6 != 3) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x44f,"ref_import_msh","node tag",3,(long)iVar6);
                          uVar3 = 1;
                        }
                        lVar10 = local_580 + lVar9;
                        if (iVar6 != 3) {
LAB_001a781d:
                          local_580 = lVar10;
                          bVar14 = false;
                          ref_node = local_568;
                          __stream = local_5a8;
                          goto LAB_001a782a;
                        }
                        uVar5 = ref_node_add(local_568,local_580 + lVar9,&local_554);
                        if (uVar5 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x450,"ref_import_msh",(ulong)uVar5,"add node");
                          uVar3 = uVar5;
                          lVar10 = lVar11;
                          goto LAB_001a781d;
                        }
                        lVar11 = lVar11 + 1;
                        pRVar1 = local_568->real;
                        lVar10 = (long)local_554;
                        pRVar1[lVar10 * 0xf] = local_540;
                        pRVar1[lVar10 * 0xf + 1] = local_548;
                        pRVar1[lVar10 * 0xf + 2] = local_448;
                        lVar9 = lVar9 + 1;
                      } while ((int)lVar9 < local_59c);
                      local_580 = local_580 + lVar9;
                      bVar14 = true;
                      ref_node = local_568;
                      __stream = local_5a8;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x449,"ref_import_msh",
                           "numEntityBlocks(size_t) numNodes(size_t) minNodeTag(size_t) maxNodeTag(size_t)"
                           ,4,(long)iVar6);
                    uVar3 = 1;
                    bVar14 = false;
                  }
LAB_001a782a:
                  if (!bVar14) goto LAB_001a78d9;
                  iVar4 = iVar4 + 1;
                } while (iVar4 < (int)local_578);
              }
              if (local_580 != (int)local_594) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x457,"ref_import_msh","node count",(long)(int)local_594,local_580);
                uVar3 = 1;
                goto LAB_001a78d9;
              }
              uVar5 = ref_node_initialize_n_global(ref_node,(long)(int)local_594);
              bVar14 = uVar5 == 0;
              if (!bVar14) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x458,"ref_import_msh",(ulong)uVar5,"init glob");
                uVar3 = uVar5;
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x440,"ref_import_msh","n entity bloc, nnode, min/max tag",4,(long)iVar4);
              uVar3 = 1;
LAB_001a78d9:
              bVar14 = false;
            }
            __stream = local_5a8;
            if (!bVar14) {
              return uVar3;
            }
          }
          if (CONCAT11(uStack_42f,local_430) == 0x73 &&
              CONCAT17(uStack_431,CONCAT16(uStack_432,CONCAT24(sStack_434,local_438))) ==
              0x746e656d656c4524) {
            iVar4 = __isoc99_fscanf(__stream,"%d %d %d %d",&local_578,&local_530,&local_58c);
            if (iVar4 == 4) {
              local_4b0 = pRVar12;
              printf("$Elements\n%d %d %d %d\n",(ulong)local_578,(ulong)local_530,(ulong)local_58c,
                     (ulong)local_590);
              if ((int)local_578 < 1) {
                bVar14 = true;
              }
              else {
                iVar4 = 0;
                do {
                  local_580 = CONCAT44(local_580._4_4_,iVar4);
                  iVar4 = __isoc99_fscanf(__stream,"%d %d %d %d",local_534,local_538,&local_550);
                  if (iVar4 == 4) {
                    printf("element bloc %d of %d\n",(ulong)local_56c,(ulong)local_550);
                    ppRVar8 = local_450;
                    switch(local_550) {
                    case 1:
                      break;
                    case 2:
                      ppRVar8 = local_4a8;
                      break;
                    case 3:
                      ppRVar8 = local_4a0;
                      break;
                    case 4:
                      ppRVar8 = local_498;
                      break;
                    case 5:
                      ppRVar8 = local_490;
                      break;
                    case 6:
                      ppRVar8 = local_488;
                      break;
                    case 7:
                      ppRVar8 = local_480;
                      break;
                    case 8:
                      ppRVar8 = local_478;
                      break;
                    case 9:
                      ppRVar8 = local_470;
                      break;
                    default:
                      bVar14 = false;
                      printf("type = %d\n");
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,0x48f,"ref_import_msh","unknown $Elements type");
                      uVar3 = 1;
                      goto LAB_001a7cd3;
                    case 0xb:
                      ppRVar8 = local_468;
                      break;
                    case 0x15:
                      ppRVar8 = local_460;
                      break;
                    case 0x1a:
                      ppRVar8 = local_458;
                    }
                    if ((int)local_56c < 1) {
                      bVar14 = true;
                    }
                    else {
                      ref_cell = *ppRVar8;
                      iVar4 = 0;
                      do {
                        iVar6 = __isoc99_fscanf(__stream,"%d",&local_59c);
                        if (iVar6 == 1) {
                          iVar6 = ref_cell->node_per;
                          if (0 < iVar6) {
                            piVar13 = local_528;
                            lVar11 = 0;
                            do {
                              iVar6 = __isoc99_fscanf(local_5a8,"%d",piVar13);
                              if (iVar6 != 1) {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                       ,0x495,"ref_import_msh","nodeTag(size_t)",1,(long)iVar6);
                                uVar3 = 1;
                                bVar14 = false;
                                __stream = local_5a8;
                                goto LAB_001a7cbb;
                              }
                              *piVar13 = *piVar13 + -1;
                              lVar11 = lVar11 + 1;
                              iVar6 = ref_cell->node_per;
                              piVar13 = piVar13 + 1;
                              __stream = local_5a8;
                            } while (lVar11 < iVar6);
                          }
                          if (ref_cell->last_node_is_an_id != 0) {
                            local_528[iVar6] = local_59c;
                          }
                          iVar7 = local_528[2];
                          iVar6 = local_528[1];
                          if (ref_cell->type == REF_CELL_PYR) {
                            local_5ac = local_528[0];
                            local_5b0 = local_528[1];
                            local_598 = local_528[2];
                            local_558 = local_528[3];
                            local_528[1] = local_528[3];
                            local_528[2] = local_518;
                            local_528[3] = iVar6;
                            local_518 = iVar7;
                          }
                          if (ref_cell->type == REF_CELL_TE2) {
                            local_508 = local_508 << 0x20 | local_508 >> 0x20;
                          }
                          uVar5 = ref_cell_add(ref_cell,local_528,&local_55c);
                          bVar14 = uVar5 == 0;
                          if (!bVar14) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x4ab,"ref_import_msh",(ulong)uVar5,"add $Element");
                            uVar3 = uVar5;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x493,"ref_import_msh","elementTag(size_t)",1,(long)iVar6);
                          uVar3 = 1;
                          bVar14 = false;
                        }
LAB_001a7cbb:
                      } while ((bVar14) && (iVar4 = iVar4 + 1, iVar4 < (int)local_56c));
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x466,"ref_import_msh",
                           "entityDim(int) entityTag(int) elementType(int) numElementsInBlock(size_t)"
                           ,4,(long)iVar4);
                    uVar3 = 1;
                    bVar14 = false;
                  }
LAB_001a7cd3:
                  ref_node = local_568;
                } while ((bVar14) && (iVar4 = (int)local_580 + 1, iVar4 < (int)local_578));
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x45e,"ref_import_msh","n entity bloc, nnode, min/max tag",4,(long)iVar4);
              uVar3 = 1;
              bVar14 = false;
              local_4b0 = pRVar12;
            }
            pRVar12 = local_4b0;
            if (!bVar14) {
              return uVar3;
            }
          }
          iVar4 = feof(__stream);
        } while (iVar4 == 0);
      }
      fclose(__stream);
      uVar3 = 6;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x3e0,
           "ref_import_msh",(ulong)uVar3,"create grid");
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_import_msh(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi,
                                         const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  char line[1024];
  REF_INT dummy;
  REF_DBL x, y, z;
  REF_INT dim, nnode, node, new_node;
  REF_INT nedge, edge, n0, n1, n2, n3, n4, n9, id;
  REF_INT ntri, tri;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], new_cell;
  REF_INT status;
  REF_INT nelem, type;
  REF_BOOL verbose = REF_TRUE;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  while (!feof(file)) {
    status = fscanf(file, "%s", line);
    if (EOF == status) return REF_SUCCESS;
    REIS(1, status, "line read failed");

    /* keywords without a leading $ are for BAMG */

    if (0 == strcmp("Dimension", line)) {
      REIS(1, fscanf(file, "%d", &dim), "read dim");
      if (2 == dim) ref_grid_twod(ref_grid) = REF_TRUE;
    }

    if (0 == strcmp("Vertices", line)) {
      REIS(1, fscanf(file, "%d", &nnode), "read nnode");
      for (node = 0; node < nnode; node++) {
        REIS(3, fscanf(file, "%lf %lf %d", &x, &y, &dummy), "read xy");
        RSS(ref_node_add(ref_node, node, &new_node), "add node");
        ref_node_xyz(ref_node, 0, new_node) = x;
        ref_node_xyz(ref_node, 1, new_node) = y;
        ref_node_xyz(ref_node, 2, new_node) = 0.0;
      }
      RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");
    }

    if (0 == strcmp("Edges", line)) {
      REIS(1, fscanf(file, "%d", &nedge), "read nedge");
      for (edge = 0; edge < nedge; edge++) {
        REIS(3, fscanf(file, "%d %d %d", &n0, &n1, &id), "read edge");
        n0--;
        n1--;
        nodes[0] = n0;
        nodes[1] = n1;
        nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &new_cell),
            "quad face for an edge");
      }
    }

    if (0 == strcmp("Triangles", line)) {
      REIS(1, fscanf(file, "%d", &ntri), "read ntri");
      for (tri = 0; tri < ntri; tri++) {
        REIS(4, fscanf(file, "%d %d %d %d", &n0, &n1, &n2, &id), "read tri");
        n0--;
        n1--;
        n2--;
        nodes[0] = n0;
        nodes[1] = n1;
        nodes[2] = n2;
        nodes[3] = id;
        RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &new_cell),
            "tri face for tri");
      }
    }

    if (0 == strcmp("Quadrilaterals", line)) {
      REIS(1, fscanf(file, "%d", &ntri), "read ntri");
      for (tri = 0; tri < ntri; tri++) {
        REIS(5, fscanf(file, "%d %d %d %d %d", &n0, &n1, &n2, &n3, &id),
             "read quad");
        n0--;
        n1--;
        n2--;
        n3--;
        nodes[0] = n0;
        nodes[1] = n1;
        nodes[2] = n2;
        nodes[3] = n3;
        nodes[4] = id;
        RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell),
            "qua face for qua");
      }
    }

    if (0 == strcmp("$MeshFormat", line)) {
      double version;
      int filetype, datasize;
      REIS(3, fscanf(file, "%lf %d %d", &version, &filetype, &datasize),
           "read version file-type data-size");
      REIS(0, filetype, "only ASCII implemented")
      REIS(8, datasize, "only doubles implemented")
      if (verbose) printf("$MeshFormat %3.1f\n", version);
    }

    if (0 == strcmp("$Nodes", line)) {
      int bloc, nbloc, mintag, maxtag;
      REF_GLOB global;
      global = 0;
      REIS(4, fscanf(file, "%d %d %d %d", &nbloc, &nnode, &mintag, &maxtag),
           "n entity bloc, nnode, min/max tag");
      if (verbose)
        printf("$Nodes\n%d %d %d %d\n", nbloc, nnode, mintag, maxtag);
      for (bloc = 0; bloc < nbloc; bloc++) {
        int entity_dim, entity_tag, parameric, n, i;
        REIS(4,
             fscanf(file, "%d %d %d %d", &entity_dim, &entity_tag, &parameric,
                    &n),
             "numEntityBlocks(size_t) numNodes(size_t) minNodeTag(size_t) "
             "maxNodeTag(size_t)");
        for (i = 0; i < n; i++) {
          int node_tag;
          REIS(1, fscanf(file, "%d", &node_tag), "node tag");
        }
        for (i = 0; i < n; i++) {
          REIS(3, fscanf(file, "%lf %lf %lf", &x, &y, &z), "node tag");
          RSS(ref_node_add(ref_node, global, &new_node), "add node");
          global++;
          ref_node_xyz(ref_node, 0, new_node) = x;
          ref_node_xyz(ref_node, 1, new_node) = y;
          ref_node_xyz(ref_node, 2, new_node) = z;
        }
      }
      REIS(nnode, global, "node count");
      RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");
    }

    if (0 == strcmp("$Elements", line)) {
      int bloc, nbloc, mintag, maxtag;
      REIS(4, fscanf(file, "%d %d %d %d", &nbloc, &nelem, &mintag, &maxtag),
           "n entity bloc, nnode, min/max tag");
      if (verbose)
        printf("$Elements\n%d %d %d %d\n", nbloc, nelem, mintag, maxtag);
      for (bloc = 0; bloc < nbloc; bloc++) {
        int entity_dim, entity_tag, n, i;
        REIS(4,
             fscanf(file, "%d %d %d %d", &entity_dim, &entity_tag, &type, &n),
             "entityDim(int) entityTag(int) elementType(int) "
             "numElementsInBlock(size_t)");
        if (verbose) printf("element bloc %d of %d\n", n, type);
        switch (type) {
          case 1:
            ref_cell = ref_grid_edg(ref_grid);
            break;
          case 2:
            ref_cell = ref_grid_tri(ref_grid);
            break;
          case 3:
            ref_cell = ref_grid_qua(ref_grid);
            break;
          case 4:
            ref_cell = ref_grid_tet(ref_grid);
            break;
          case 5:
            ref_cell = ref_grid_hex(ref_grid);
            break;
          case 6:
            ref_cell = ref_grid_pri(ref_grid);
            break;
          case 7:
            ref_cell = ref_grid_pyr(ref_grid);
            break;
          case 8:
            ref_cell = ref_grid_ed2(ref_grid);
            break;
          case 9:
            ref_cell = ref_grid_tr2(ref_grid);
            break;
          case 11:
            ref_cell = ref_grid_te2(ref_grid);
            break;
          case 21:
            ref_cell = ref_grid_tr3(ref_grid);
            break;
          case 26:
            ref_cell = ref_grid_ed3(ref_grid);
            break;
          default:
            printf("type = %d\n", type);
            THROW("unknown $Elements type");
        }
        for (i = 0; i < n; i++) {
          REF_INT cell_node, tag;
          REIS(1, fscanf(file, "%d", &tag), "elementTag(size_t)");
          each_ref_cell_cell_node(ref_cell, cell_node) {
            REIS(1, fscanf(file, "%d", &(nodes[cell_node])), "nodeTag(size_t)");
            (nodes[cell_node])--;
          }
          if (ref_cell_last_node_is_an_id(ref_cell))
            nodes[ref_cell_id_index(ref_cell)] = tag;
          if (REF_CELL_PYR == ref_cell_type(ref_cell)) { /* on side */
            n0 = nodes[0];
            n1 = nodes[1];
            n2 = nodes[2];
            n3 = nodes[3];
            n4 = nodes[4];
            nodes[0] = n0;
            nodes[1] = n3;
            nodes[2] = n4;
            nodes[3] = n1;
            nodes[4] = n2;
          }
          if (REF_CELL_TE2 == ref_cell_type(ref_cell)) { /* swap 8-9 */
            n9 = nodes[9];
            nodes[9] = nodes[8];
            nodes[8] = n9;
          }
          RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add $Element");
        }
      }
    }
  }

  fclose(file);

  return REF_IMPLEMENT;
}